

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O3

sizes xor8(size_t n)

{
  ulong *puVar1;
  uint uVar2;
  undefined4 uVar3;
  size_t __size;
  size_t __size_00;
  undefined1 auVar4 [16];
  uint uVar5;
  void *__ptr;
  uint64_t *keys;
  void *__s;
  void *__ptr_00;
  void *__ptr_01;
  long lVar6;
  uint64_t uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  size_t i_1;
  ulong uVar23;
  undefined4 *puVar24;
  uint32_t r0;
  ulong uVar25;
  size_t capacity;
  long lVar26;
  size_t sVar27;
  ulong uVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  sizes sVar33;
  ulong local_b8;
  
  dVar29 = (double)(n & 0xffffffff) * 1.23 + 32.0;
  uVar10 = (ulong)dVar29;
  uVar10 = (long)(dVar29 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
  uVar11 = uVar10 / 3;
  __size = uVar11 * 3;
  __ptr = malloc(__size);
  if (__ptr == (void *)0x0) {
    puts("allocation failed");
    sVar27 = 0;
    sVar15 = 0;
    goto LAB_001031e5;
  }
  keys = (uint64_t *)malloc(n * 8);
  auVar4 = _DAT_00104060;
  if (n == 0) {
LAB_00103180:
    puts("populating failed");
  }
  else {
    lVar26 = n - 1;
    auVar30._8_4_ = (int)lVar26;
    auVar30._0_8_ = lVar26;
    auVar30._12_4_ = (int)((ulong)lVar26 >> 0x20);
    uVar7 = 0;
    auVar30 = auVar30 ^ _DAT_00104060;
    auVar31 = _DAT_00104050;
    do {
      auVar32 = auVar31 ^ auVar4;
      if ((bool)(~(auVar32._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar32._0_4_ ||
                  auVar30._4_4_ < auVar32._4_4_) & 1)) {
        keys[uVar7] = uVar7;
      }
      if ((auVar32._12_4_ != auVar30._12_4_ || auVar32._8_4_ <= auVar30._8_4_) &&
          auVar32._12_4_ <= auVar30._12_4_) {
        keys[uVar7 + 1] = uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar26 = auVar31._8_8_;
      auVar31._0_8_ = auVar31._0_8_ + 2;
      auVar31._8_8_ = lVar26 + 2;
    } while ((n + 1 & 0xfffffffffffffffe) != uVar7);
    if ((int)n == 0) goto LAB_00103180;
    lVar26 = uVar11 * 0x10;
    __size_00 = uVar11 * 0x30;
    __s = malloc(__size_00);
    __ptr_00 = malloc(__size_00);
    __ptr_01 = malloc((n & 0xffffffff) << 4);
    if (__ptr_01 == (void *)0x0 || (__ptr_00 == (void *)0x0 || __s == (void *)0x0)) {
LAB_00103157:
      free(__s);
      free(__ptr_00);
      free(__ptr_01);
      goto LAB_00103180;
    }
    lVar6 = uVar11 * 0x20;
    uVar28 = uVar11 & 0xffffffff;
    uVar14 = 0x9e3779b97f4a7c16;
    uVar16 = 0x910a2dec89025cc1;
    uVar5 = 0;
    local_b8 = n;
    while( true ) {
      if (uVar5 + 1 == 10) {
        local_b8 = xor_sort_and_remove_dup(keys,local_b8 & 0xffffffff);
      }
      else if (99 < uVar5) goto LAB_00103157;
      memset(__s,0,__size_00);
      uVar25 = local_b8 & 0xffffffff;
      if ((int)local_b8 != 0) {
        uVar8 = 0;
        do {
          uVar17 = (keys[uVar8] + uVar16 >> 0x21 ^ keys[uVar8] + uVar16) * -0xae502812aa7333;
          uVar21 = (uVar17 >> 0x21 ^ uVar17) * -0x3b314601e57a13ad;
          uVar17 = uVar21 >> 0x21 ^ uVar21;
          uVar23 = (uVar17 & 0xffffffff) * uVar28 >> 0x1c & 0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar23);
          *puVar1 = *puVar1 ^ uVar17;
          piVar12 = (int *)((long)__s + uVar23 + 8);
          *piVar12 = *piVar12 + 1;
          uVar21 = ((uint)(uVar17 << 0x15) | (uint)(uVar21 >> 0x2b)) * uVar28 >> 0x1c &
                   0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar21 + lVar26);
          *puVar1 = *puVar1 ^ uVar17;
          piVar12 = (int *)((long)__s + uVar21 + lVar26 + 8);
          *piVar12 = *piVar12 + 1;
          uVar21 = (uVar17 >> 0x16 & 0xffffffff) * uVar28 >> 0x1c & 0xfffffffffffffff0;
          puVar1 = (ulong *)((long)__s + uVar21 + lVar6);
          *puVar1 = *puVar1 ^ uVar17;
          piVar12 = (int *)((long)__s + uVar21 + lVar6 + 8);
          *piVar12 = *piVar12 + 1;
          uVar8 = uVar8 + 1;
        } while (uVar25 != uVar8);
      }
      if (uVar10 < 3) {
        lVar13 = 0;
        lVar9 = 0;
        lVar18 = 0;
      }
      else {
        lVar9 = 0;
        uVar16 = 0;
        piVar12 = (int *)((long)__s + 8);
        do {
          if (*piVar12 == 1) {
            *(int *)((long)__ptr_00 + lVar9 * 0x10 + 8) = (int)uVar16;
            *(undefined8 *)((long)__ptr_00 + lVar9 * 0x10) = *(undefined8 *)(piVar12 + -2);
            lVar9 = lVar9 + 1;
          }
          uVar16 = uVar16 + 1;
          piVar12 = piVar12 + 4;
        } while (uVar11 != uVar16);
        lVar13 = 0;
        uVar16 = 0;
        piVar12 = (int *)((long)__s + lVar26 + 8);
        do {
          if (*piVar12 == 1) {
            *(int *)((long)__ptr_00 + lVar13 * 0x10 + lVar26 + 8) = (int)uVar16;
            *(undefined8 *)((long)__ptr_00 + lVar13 * 0x10 + lVar26) = *(undefined8 *)(piVar12 + -2)
            ;
            lVar13 = lVar13 + 1;
          }
          uVar16 = uVar16 + 1;
          piVar12 = piVar12 + 4;
        } while (uVar11 != uVar16);
        lVar18 = 0;
        uVar16 = 0;
        piVar12 = (int *)((long)__s + lVar6 + 8);
        do {
          if (*piVar12 == 1) {
            *(int *)((long)__ptr_00 + lVar18 * 0x10 + lVar6 + 8) = (int)uVar16;
            *(undefined8 *)((long)__ptr_00 + lVar18 * 0x10 + lVar6) = *(undefined8 *)(piVar12 + -2);
            lVar18 = lVar18 + 1;
          }
          uVar16 = uVar16 + 1;
          piVar12 = piVar12 + 4;
        } while (uVar11 != uVar16);
      }
      uVar16 = 0;
      lVar22 = lVar9 + lVar13 + lVar18;
      while (lVar22 != 0) {
        if (lVar9 != 0) {
          puVar24 = (undefined4 *)((long)__ptr_00 + lVar9 * 0x10 + -4);
          do {
            uVar2 = puVar24[-1];
            if (*(int *)((long)__s + (ulong)uVar2 * 0x10 + 8) != 0) {
              uVar8 = *(ulong *)(puVar24 + -3);
              uVar3 = *puVar24;
              uVar17 = ((uint)(uVar8 << 0x15) | (uint)(uVar8 >> 0x2b)) * uVar28;
              lVar22 = uVar16 * 0x10;
              *(ulong *)((long)__ptr_01 + lVar22) = uVar8;
              *(uint *)((long)__ptr_01 + lVar22 + 8) = uVar2;
              *(undefined4 *)((long)__ptr_01 + lVar22 + 0xc) = uVar3;
              lVar22 = (uVar17 >> 0x20) * 0x10;
              uVar21 = *(ulong *)((long)__s + lVar22 + lVar26) ^ uVar8;
              *(ulong *)((long)__s + lVar22 + lVar26) = uVar21;
              iVar20 = *(int *)((long)__s + lVar22 + lVar26 + 8) + -1;
              *(int *)((long)__s + lVar22 + lVar26 + 8) = iVar20;
              if (iVar20 == 1) {
                *(int *)((long)__ptr_00 + lVar13 * 0x10 + lVar26 + 8) = (int)(uVar17 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar13 * 0x10 + lVar26) = uVar21;
                lVar13 = lVar13 + 1;
              }
              uVar17 = (uVar8 >> 0x16 & 0xffffffff) * uVar28;
              uVar16 = uVar16 + 1;
              lVar22 = (uVar17 >> 0x20) * 0x10;
              uVar8 = uVar8 ^ *(ulong *)((long)__s + lVar22 + lVar6);
              *(ulong *)((long)__s + lVar22 + lVar6) = uVar8;
              iVar20 = *(int *)((long)__s + lVar22 + lVar6 + 8) + -1;
              *(int *)((long)__s + lVar22 + lVar6 + 8) = iVar20;
              if (iVar20 == 1) {
                *(int *)((long)__ptr_00 + lVar18 * 0x10 + lVar6 + 8) = (int)(uVar17 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar18 * 0x10 + lVar6) = uVar8;
                lVar18 = lVar18 + 1;
              }
            }
            lVar9 = lVar9 + -1;
            puVar24 = puVar24 + -4;
          } while (lVar9 != 0);
        }
        if (lVar13 == 0) {
          lVar9 = 0;
        }
        else {
          puVar24 = (undefined4 *)((long)__ptr_00 + lVar13 * 0x10 + lVar26 + -4);
          lVar9 = 0;
          do {
            uVar2 = puVar24[-1];
            if (*(int *)((long)__s + (ulong)uVar2 * 0x10 + lVar26 + 8) != 0) {
              uVar8 = *(ulong *)(puVar24 + -3);
              uVar3 = *puVar24;
              uVar17 = (uVar8 & 0xffffffff) * uVar28;
              lVar22 = uVar16 * 0x10;
              *(ulong *)((long)__ptr_01 + lVar22) = uVar8;
              *(uint *)((long)__ptr_01 + lVar22 + 8) = uVar2 + (int)uVar11;
              *(undefined4 *)((long)__ptr_01 + lVar22 + 0xc) = uVar3;
              lVar22 = (uVar17 >> 0x20) * 0x10;
              uVar21 = *(ulong *)((long)__s + lVar22) ^ uVar8;
              *(ulong *)((long)__s + lVar22) = uVar21;
              iVar20 = *(int *)((long)__s + lVar22 + 8) + -1;
              *(int *)((long)__s + lVar22 + 8) = iVar20;
              if (iVar20 == 1) {
                *(int *)((long)__ptr_00 + lVar9 * 0x10 + 8) = (int)(uVar17 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar9 * 0x10) = uVar21;
                lVar9 = lVar9 + 1;
              }
              uVar17 = (uVar8 >> 0x16 & 0xffffffff) * uVar28;
              uVar16 = uVar16 + 1;
              lVar22 = (uVar17 >> 0x20) * 0x10;
              uVar8 = uVar8 ^ *(ulong *)((long)__s + lVar22 + lVar6);
              *(ulong *)((long)__s + lVar22 + lVar6) = uVar8;
              iVar20 = *(int *)((long)__s + lVar22 + lVar6 + 8) + -1;
              *(int *)((long)__s + lVar22 + lVar6 + 8) = iVar20;
              if (iVar20 == 1) {
                *(int *)((long)__ptr_00 + lVar18 * 0x10 + lVar6 + 8) = (int)(uVar17 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar18 * 0x10 + lVar6) = uVar8;
                lVar18 = lVar18 + 1;
              }
            }
            lVar13 = lVar13 + -1;
            puVar24 = puVar24 + -4;
          } while (lVar13 != 0);
        }
        if (lVar18 == 0) {
          lVar13 = 0;
        }
        else {
          puVar24 = (undefined4 *)((long)__ptr_00 + lVar18 * 0x10 + lVar6 + -4);
          lVar13 = 0;
          do {
            uVar2 = puVar24[-1];
            if (*(int *)((long)__s + (ulong)uVar2 * 0x10 + lVar6 + 8) != 0) {
              uVar8 = *(ulong *)(puVar24 + -3);
              uVar3 = *puVar24;
              uVar17 = (uVar8 & 0xffffffff) * uVar28;
              lVar22 = uVar16 * 0x10;
              *(ulong *)((long)__ptr_01 + lVar22) = uVar8;
              *(uint *)((long)__ptr_01 + lVar22 + 8) = uVar2 + (int)uVar11 * 2;
              *(undefined4 *)((long)__ptr_01 + lVar22 + 0xc) = uVar3;
              lVar22 = (uVar17 >> 0x20) * 0x10;
              uVar21 = *(ulong *)((long)__s + lVar22) ^ uVar8;
              *(ulong *)((long)__s + lVar22) = uVar21;
              iVar20 = *(int *)((long)__s + lVar22 + 8) + -1;
              *(int *)((long)__s + lVar22 + 8) = iVar20;
              if (iVar20 == 1) {
                *(int *)((long)__ptr_00 + lVar9 * 0x10 + 8) = (int)(uVar17 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar9 * 0x10) = uVar21;
                lVar9 = lVar9 + 1;
              }
              uVar17 = ((uint)(uVar8 << 0x15) | (uint)(uVar8 >> 0x2b)) * uVar28;
              uVar16 = uVar16 + 1;
              lVar22 = (uVar17 >> 0x20) * 0x10;
              uVar8 = uVar8 ^ *(ulong *)((long)__s + lVar22 + lVar26);
              *(ulong *)((long)__s + lVar22 + lVar26) = uVar8;
              iVar20 = *(int *)((long)__s + lVar22 + lVar26 + 8) + -1;
              *(int *)((long)__s + lVar22 + lVar26 + 8) = iVar20;
              if (iVar20 == 1) {
                *(int *)((long)__ptr_00 + lVar13 * 0x10 + lVar26 + 8) = (int)(uVar17 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar13 * 0x10 + lVar26) = uVar8;
                lVar13 = lVar13 + 1;
              }
            }
            lVar18 = lVar18 + -1;
            puVar24 = puVar24 + -4;
          } while (lVar18 != 0);
        }
        lVar18 = 0;
        lVar22 = lVar9 + lVar13;
      }
      if (uVar16 == uVar25) break;
      uVar14 = uVar14 + 0x9e3779b97f4a7c15;
      uVar16 = (uVar14 >> 0x1e ^ uVar14) * -0x40a7b892e31b1a47;
      uVar16 = (uVar16 >> 0x1b ^ uVar16) * -0x6b2fb644ecceee15;
      uVar16 = uVar16 >> 0x1f ^ uVar16;
      uVar5 = uVar5 + 1;
    }
    if ((int)local_b8 != 0) {
      lVar26 = uVar25 << 4;
      do {
        uVar14 = *(ulong *)((long)__ptr_01 + lVar26 + -0x10);
        uVar16 = (ulong)*(uint *)((long)__ptr_01 + lVar26 + -8);
        if (uVar16 < uVar11) {
          bVar19 = *(byte *)((long)__ptr +
                            (((uint)(uVar14 << 0x15) | (uint)(uVar14 >> 0x2b)) * uVar28 >> 0x20) +
                            uVar11);
          uVar25 = uVar28;
LAB_0010385a:
          uVar17 = uVar14 >> 0x16;
          uVar8 = uVar11 * 2;
        }
        else {
          bVar19 = *(byte *)((long)__ptr + ((uVar14 & 0xffffffff) * uVar11 >> 0x20));
          uVar25 = uVar11;
          if (uVar16 < uVar11 * 2) goto LAB_0010385a;
          uVar17 = uVar14 << 0x15 | uVar14 >> 0x2b;
          uVar8 = uVar11;
        }
        *(byte *)((long)__ptr + uVar16) =
             (byte)(uVar14 >> 0x20) ^ (byte)uVar14 ^ bVar19 ^
             *(byte *)((long)__ptr + ((uVar17 & 0xffffffff) * uVar25 >> 0x20) + uVar8);
        lVar26 = lVar26 + -0x10;
      } while (lVar26 != 0);
    }
    free(__s);
    free(__ptr_00);
    free(__ptr_01);
  }
  free(keys);
  sVar15 = (__size + 7 >> 3) + 0x10;
  if (2 < uVar10) {
    lVar26 = 0;
    do {
      sVar15 = (sVar15 + 1) - (ulong)(*(char *)((long)__ptr + lVar26) == '\0');
      lVar26 = lVar26 + 1;
    } while (__size + (__size == 0) != lVar26);
  }
  sVar27 = __size + 0x10;
  free(__ptr);
LAB_001031e5:
  sVar33.pack = sVar15;
  sVar33.standard = sVar27;
  return sVar33;
}

Assistant:

sizes xor8(size_t n) {
  xor8_t filter = {0};
  if (! xor8_allocate(n, &filter)) {
    printf("allocation failed\n");
    return (sizes) {0, 0};
  }
  uint64_t* big_set = malloc(n * sizeof(uint64_t));
  for(size_t i = 0; i < n; i++) {
    big_set[i] = i;
  }
  bool is_ok = xor8_populate(big_set, n, &filter);
  if(! is_ok ) {
    printf("populating failed\n");
  }
  free(big_set);
  sizes s = {
    .standard = xor8_serialization_bytes(&filter),
    .pack = xor8_pack_bytes(&filter)
  };
  xor8_free(&filter);

  return s;
}